

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdarith.c
# Opt level: O3

boolean decode_mcu_AC_refine(j_decompress_ptr cinfo,JBLOCKROW *MCU_data)

{
  long lVar1;
  byte bVar2;
  uint uVar3;
  int iVar4;
  jpeg_entropy_decoder *pjVar5;
  int *piVar6;
  JBLOCKROW paJVar7;
  jpeg_error_mgr *pjVar8;
  bool bVar9;
  short sVar10;
  short sVar11;
  int iVar12;
  int iVar13;
  uint uVar14;
  long lVar15;
  int iVar16;
  _func_boolean_j_decompress_ptr_JBLOCKROW_ptr *p_Var17;
  
  pjVar5 = cinfo->entropy;
  if (cinfo->restart_interval != 0) {
    iVar16 = *(int *)((long)&pjVar5[4].start_pass + 4);
    if (iVar16 == 0) {
      process_restart(cinfo);
      iVar16 = *(int *)((long)&pjVar5[4].start_pass + 4);
    }
    *(int *)((long)&pjVar5[4].start_pass + 4) = iVar16 + -1;
  }
  if (*(int *)&pjVar5[2].start_pass != -1) {
    piVar6 = cinfo->natural_order;
    bVar2 = (byte)cinfo->Al;
    paJVar7 = *MCU_data;
    uVar3 = cinfo->Se;
    uVar14 = uVar3;
    if (0 < (int)uVar3) {
      do {
        if ((*paJVar7)[piVar6[uVar14]] != 0) goto LAB_0011522d;
        bVar9 = 1 < (int)uVar14;
        uVar14 = uVar14 - 1;
      } while (bVar9);
      uVar14 = 0;
    }
LAB_0011522d:
    iVar16 = cinfo->Ss;
    if (iVar16 <= (int)uVar3) {
      iVar4 = cinfo->cur_comp_info[0]->ac_tbl_no;
      do {
        p_Var17 = (&pjVar5[0xc].decode_mcu)[iVar4];
        lVar15 = (long)(iVar16 * 3 + -3);
        if (((int)uVar14 < iVar16) &&
           (iVar12 = arith_decode(cinfo,(uchar *)(p_Var17 + lVar15)), iVar12 != 0)) {
          return 1;
        }
        p_Var17 = p_Var17 + lVar15 + 2;
        lVar15 = 0;
        while( true ) {
          iVar12 = piVar6[iVar16 + lVar15];
          sVar11 = (short)(1 << (bVar2 & 0x1f));
          sVar10 = (short)(-1 << (bVar2 & 0x1f));
          if ((*paJVar7)[iVar12] != 0) break;
          iVar13 = arith_decode(cinfo,(uchar *)(p_Var17 + -1));
          if (iVar13 != 0) {
            iVar13 = arith_decode(cinfo,(uchar *)&pjVar5[0x14].decode_mcu);
            if (iVar13 != 0) {
              sVar11 = sVar10;
            }
            (*paJVar7)[iVar12] = sVar11;
            goto LAB_00115380;
          }
          lVar1 = iVar16 + lVar15;
          lVar15 = lVar15 + 1;
          p_Var17 = p_Var17 + 3;
          if (cinfo->Se <= lVar1) {
            pjVar8 = cinfo->err;
            pjVar8->msg_code = 0x75;
            (*pjVar8->emit_message)((j_common_ptr)cinfo,-1);
            *(undefined4 *)&pjVar5[2].start_pass = 0xffffffff;
            return 1;
          }
        }
        iVar13 = arith_decode(cinfo,(uchar *)p_Var17);
        if (iVar13 != 0) {
          if (-1 < (*paJVar7)[iVar12]) {
            sVar10 = sVar11;
          }
          (*paJVar7)[iVar12] = (*paJVar7)[iVar12] + sVar10;
        }
LAB_00115380:
        iVar12 = iVar16 + (int)lVar15;
        iVar16 = iVar16 + (int)lVar15 + 1;
      } while (iVar12 < cinfo->Se);
    }
  }
  return 1;
}

Assistant:

METHODDEF(boolean)
decode_mcu_AC_refine (j_decompress_ptr cinfo, JBLOCKROW *MCU_data)
{
  arith_entropy_ptr entropy = (arith_entropy_ptr) cinfo->entropy;
  JBLOCKROW block;
  JCOEFPTR thiscoef;
  unsigned char *st;
  int tbl, k, kex;
  int p1, m1;
  const int * natural_order;

  /* Process restart marker if needed */
  if (cinfo->restart_interval) {
    if (entropy->restarts_to_go == 0)
      process_restart(cinfo);
    entropy->restarts_to_go--;
  }

  if (entropy->ct == -1) return TRUE;	/* if error do nothing */

  natural_order = cinfo->natural_order;

  /* There is always only one block per MCU */
  block = MCU_data[0];
  tbl = cinfo->cur_comp_info[0]->ac_tbl_no;

  p1 = 1 << cinfo->Al;		/* 1 in the bit position being coded */
  m1 = (-1) << cinfo->Al;	/* -1 in the bit position being coded */

  /* Establish EOBx (previous stage end-of-block) index */
  for (kex = cinfo->Se; kex > 0; kex--)
    if ((*block)[natural_order[kex]]) break;

  for (k = cinfo->Ss; k <= cinfo->Se; k++) {
    st = entropy->ac_stats[tbl] + 3 * (k - 1);
    if (k > kex)
      if (arith_decode(cinfo, st)) break;	/* EOB flag */
    for (;;) {
      thiscoef = *block + natural_order[k];
      if (*thiscoef) {				/* previously nonzero coef */
	if (arith_decode(cinfo, st + 2)) {
	  if (*thiscoef < 0)
	    *thiscoef += m1;
	  else
	    *thiscoef += p1;
	}
	break;
      }
      if (arith_decode(cinfo, st + 1)) {	/* newly nonzero coef */
	if (arith_decode(cinfo, entropy->fixed_bin))
	  *thiscoef = m1;
	else
	  *thiscoef = p1;
	break;
      }
      st += 3; k++;
      if (k > cinfo->Se) {
	WARNMS(cinfo, JWRN_ARITH_BAD_CODE);
	entropy->ct = -1;			/* spectral overflow */
	return TRUE;
      }
    }
  }

  return TRUE;
}